

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **aData,sqlite_int64 *pRowid)

{
  uint uVar1;
  uint uVar2;
  Mem *pMVar3;
  sqlite3_stmt *pStmt;
  double dVar4;
  bool bVar5;
  RtreeNode *pNode;
  uint uVar9;
  int iVar6;
  i64 iVar7;
  i64 iVar8;
  int iVar10;
  long lVar11;
  long in_FS_OFFSET;
  float fVar12;
  float fVar13;
  RtreeNode *pLeaf;
  RtreeCell local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = 0x206;
  if (*(int *)((long)&pVtab[3].zErrMsg + 4) != 0) goto LAB_001d9c0d;
  *(int *)&pVtab[3].pModule = *(int *)&pVtab[3].pModule + 1;
  local_68.aCoord[6] = (RtreeCoord)0x0;
  local_68.aCoord[7] = (RtreeCoord)0x0;
  local_68.aCoord[8] = (RtreeCoord)0x0;
  local_68.aCoord[9] = (RtreeCoord)0x0;
  local_68.aCoord[2] = (RtreeCoord)0x0;
  local_68.aCoord[3] = (RtreeCoord)0x0;
  local_68.aCoord[4] = (RtreeCoord)0x0;
  local_68.aCoord[5] = (RtreeCoord)0x0;
  local_68.iRowid = 0;
  local_68.aCoord[0] = (RtreeCoord)0x0;
  local_68.aCoord[1] = (RtreeCoord)0x0;
  iVar10 = 0;
  bVar5 = true;
  if (nData < 2) goto LAB_001d9b8e;
  uVar9 = (uint)(byte)pVtab[1].field_0xd;
  if ((int)(nData - 4U) < (int)(uint)(byte)pVtab[1].field_0xd) {
    uVar9 = nData - 4U;
  }
  if (pVtab[1].field_0xe == '\0') {
    lVar11 = 0;
    do {
      if ((int)uVar9 <= lVar11) goto LAB_001d9ac0;
      dVar4 = sqlite3VdbeRealValue(aData[lVar11 + 3]);
      fVar13 = (float)dVar4;
      if (dVar4 < (double)fVar13) {
        fVar13 = (float)(dVar4 * *(double *)(&DAT_001eb000 + (ulong)(dVar4 < 0.0) * 8));
      }
      local_68.aCoord[lVar11].f = fVar13;
      dVar4 = sqlite3VdbeRealValue(aData[lVar11 + 4]);
      fVar12 = (float)dVar4;
      if ((double)fVar12 < dVar4) {
        fVar12 = (float)(dVar4 * *(double *)(&DAT_001eb010 + (ulong)(dVar4 < 0.0) * 8));
      }
      local_68.aCoord[lVar11 + 1].f = fVar12;
      lVar11 = lVar11 + 2;
    } while (fVar13 <= fVar12);
  }
  else {
    lVar11 = 0;
    do {
      if ((int)uVar9 <= lVar11) goto LAB_001d9ac0;
      iVar7 = sqlite3VdbeIntValue(aData[lVar11 + 3]);
      local_68.aCoord[lVar11].i = (int)iVar7;
      iVar8 = sqlite3VdbeIntValue(aData[lVar11 + 4]);
      local_68.aCoord[lVar11 + 1].i = (int)iVar8;
      lVar11 = lVar11 + 2;
    } while ((int)iVar7 <= (int)iVar8);
  }
  iVar10 = (int)lVar11 + -1;
LAB_001d9ab6:
  iVar10 = rtreeConstraintError((Rtree *)pVtab,iVar10);
  goto LAB_001d9c05;
LAB_001d9ac0:
  pMVar3 = aData[2];
  uVar9._0_2_ = pMVar3->flags;
  uVar9._2_1_ = pMVar3->enc;
  uVar9._3_1_ = pMVar3->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
    iVar7 = sqlite3VdbeIntValue(pMVar3);
    pMVar3 = *aData;
    uVar1._0_2_ = pMVar3->flags;
    uVar1._2_1_ = pMVar3->enc;
    uVar1._3_1_ = pMVar3->eSubtype;
    local_68.iRowid = iVar7;
    if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      iVar8 = sqlite3VdbeIntValue(pMVar3);
      bVar5 = false;
      iVar10 = 0;
      if (iVar8 == iVar7) goto LAB_001d9b8e;
    }
    sqlite3_bind_int64((sqlite3_stmt *)pVtab[5].zErrMsg,1,iVar7);
    iVar6 = sqlite3_step((sqlite3_stmt *)pVtab[5].zErrMsg);
    iVar10 = sqlite3_reset((sqlite3_stmt *)pVtab[5].zErrMsg);
    if (iVar6 == 100) {
      if (*(char *)((long)&(pVtab[1].pModule)->xUpdate + 4) != '\x05') {
        iVar10 = 0;
        goto LAB_001d9ab6;
      }
      iVar10 = rtreeDeleteRowid((Rtree *)pVtab,iVar7);
    }
    bVar5 = false;
  }
LAB_001d9b8e:
  pMVar3 = *aData;
  uVar2._0_2_ = pMVar3->flags;
  uVar2._2_1_ = pMVar3->enc;
  uVar2._3_1_ = pMVar3->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
    iVar7 = sqlite3VdbeIntValue(pMVar3);
    iVar10 = rtreeDeleteRowid((Rtree *)pVtab,iVar7);
  }
  if ((1 < nData) && (iVar10 == 0)) {
    pLeaf = (RtreeNode *)0x0;
    if (bVar5) {
      iVar10 = rtreeNewRowid((Rtree *)pVtab,&local_68.iRowid);
      *pRowid = local_68.iRowid;
      if (iVar10 != 0) goto LAB_001d9c05;
    }
    else {
      *pRowid = local_68.iRowid;
    }
    iVar10 = ChooseLeaf((Rtree *)pVtab,&local_68,0,&pLeaf);
    pNode = pLeaf;
    if (iVar10 == 0) {
      iVar6 = rtreeInsertCell((Rtree *)pVtab,pLeaf,&local_68,0);
      iVar10 = nodeRelease((Rtree *)pVtab,pNode);
      if (iVar6 != 0) {
        iVar10 = iVar6;
      }
      if ((iVar10 == 0) && (iVar10 = 0, *(char *)((long)&pVtab[1].zErrMsg + 1) != '\0')) {
        pStmt = (sqlite3_stmt *)pVtab[7].zErrMsg;
        sqlite3_bind_int64(pStmt,1,*pRowid);
        for (lVar11 = 3; (int)lVar11 - 3U < (uint)*(byte *)((long)&pVtab[1].zErrMsg + 1);
            lVar11 = lVar11 + 1) {
          sqlite3_bind_value(pStmt,(int)lVar11 + -1,aData[(ulong)(byte)pVtab[1].field_0xd + lVar11])
          ;
        }
        sqlite3_step(pStmt);
        iVar10 = sqlite3_reset(pStmt);
      }
    }
  }
LAB_001d9c05:
  rtreeRelease((Rtree *)pVtab);
LAB_001d9c0d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar10;
}

Assistant:

static int rtreeUpdate(
  sqlite3_vtab *pVtab,
  int nData,
  sqlite3_value **aData,
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  int bHaveRowid = 0;             /* Set to 1 after new rowid is determined */

  if( pRtree->nNodeRef ){
    /* Unable to write to the btree while another cursor is reading from it,
    ** since the write might do a rebalance which would disrupt the read
    ** cursor. */
    return SQLITE_LOCKED_VTAB;
  }
  rtreeReference(pRtree);
  assert(nData>=1);

  memset(&cell, 0, sizeof(cell));

  /* Constraint handling. A write operation on an r-tree table may return
  ** SQLITE_CONSTRAINT for two reasons:
  **
  **   1. A duplicate rowid value, or
  **   2. The supplied data violates the "x2>=x1" constraint.
  **
  ** In the first case, if the conflict-handling mode is REPLACE, then
  ** the conflicting row can be removed before proceeding. In the second
  ** case, SQLITE_CONSTRAINT must be returned regardless of the
  ** conflict-handling mode specified by the user.
  */
  if( nData>1 ){
    int ii;
    int nn = nData - 4;

    if( nn > pRtree->nDim2 ) nn = pRtree->nDim2;
    /* Populate the cell.aCoord[] array. The first coordinate is aData[3].
    **
    ** NB: nData can only be less than nDim*2+3 if the rtree is mis-declared
    ** with "column" that are interpreted as table constraints.
    ** Example:  CREATE VIRTUAL TABLE bad USING rtree(x,y,CHECK(y>5));
    ** This problem was discovered after years of use, so we silently ignore
    ** these kinds of misdeclared tables to avoid breaking any legacy.
    */

#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].f = rtreeValueDown(aData[ii+3]);
        cell.aCoord[ii+1].f = rtreeValueUp(aData[ii+4]);
        if( cell.aCoord[ii].f>cell.aCoord[ii+1].f ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }else
#endif
    {
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].i = sqlite3_value_int(aData[ii+3]);
        cell.aCoord[ii+1].i = sqlite3_value_int(aData[ii+4]);
        if( cell.aCoord[ii].i>cell.aCoord[ii+1].i ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }

    /* If a rowid value was supplied, check if it is already present in
    ** the table. If so, the constraint has failed. */
    if( sqlite3_value_type(aData[2])!=SQLITE_NULL ){
      cell.iRowid = sqlite3_value_int64(aData[2]);
      if( sqlite3_value_type(aData[0])==SQLITE_NULL
       || sqlite3_value_int64(aData[0])!=cell.iRowid
      ){
        int steprc;
        sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
        steprc = sqlite3_step(pRtree->pReadRowid);
        rc = sqlite3_reset(pRtree->pReadRowid);
        if( SQLITE_ROW==steprc ){
          if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
            rc = rtreeDeleteRowid(pRtree, cell.iRowid);
          }else{
            rc = rtreeConstraintError(pRtree, 0);
            goto constraint;
          }
        }
      }
      bHaveRowid = 1;
    }
  }

  /* If aData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( sqlite3_value_type(aData[0])!=SQLITE_NULL ){
    rc = rtreeDeleteRowid(pRtree, sqlite3_value_int64(aData[0]));
  }

  /* If the aData[] array contains more than one element, elements
  ** (aData[2]..aData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;

    /* Figure out the rowid of the new row. */
    if( bHaveRowid==0 ){
      rc = rtreeNewRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;

    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
    if( rc==SQLITE_OK && pRtree->nAux ){
      sqlite3_stmt *pUp = pRtree->pWriteAux;
      int jj;
      sqlite3_bind_int64(pUp, 1, *pRowid);
      for(jj=0; jj<pRtree->nAux; jj++){
        sqlite3_bind_value(pUp, jj+2, aData[pRtree->nDim2+3+jj]);
      }
      sqlite3_step(pUp);
      rc = sqlite3_reset(pUp);
    }
  }

constraint:
  rtreeRelease(pRtree);
  return rc;
}